

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O0

CordzStatistics * __thiscall
absl::lts_20240722::cord_internal::CordzInfo::GetCordzStatistics
          (CordzStatistics *__return_storage_ptr__,CordzInfo *this)

{
  undefined1 local_38 [8];
  CordRepAnalyzer analyzer;
  CordRep *rep;
  CordzInfo *this_local;
  CordzStatistics *stats;
  
  CordzStatistics::CordzStatistics(__return_storage_ptr__);
  __return_storage_ptr__->method = this->method_;
  __return_storage_ptr__->parent_method = this->parent_method_;
  CordzUpdateTracker::operator=(&__return_storage_ptr__->update_tracker,&this->update_tracker_);
  analyzer.memory_usage_.fair_share = (double)RefCordRep(this);
  if ((CordRep *)analyzer.memory_usage_.fair_share != (CordRep *)0x0) {
    __return_storage_ptr__->size = ((CordRep *)analyzer.memory_usage_.fair_share)->length;
    anon_unknown_16::CordRepAnalyzer::CordRepAnalyzer
              ((CordRepAnalyzer *)local_38,__return_storage_ptr__);
    anon_unknown_16::CordRepAnalyzer::AnalyzeCordRep
              ((CordRepAnalyzer *)local_38,(CordRep *)analyzer.memory_usage_.fair_share);
    CordRep::Unref((CordRep *)analyzer.memory_usage_.fair_share);
  }
  return __return_storage_ptr__;
}

Assistant:

CordzStatistics CordzInfo::GetCordzStatistics() const {
  CordzStatistics stats;
  stats.method = method_;
  stats.parent_method = parent_method_;
  stats.update_tracker = update_tracker_;
  if (CordRep* rep = RefCordRep()) {
    stats.size = rep->length;
    CordRepAnalyzer analyzer(stats);
    analyzer.AnalyzeCordRep(rep);
    CordRep::Unref(rep);
  }
  return stats;
}